

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O3

void __thiscall Imf_2_5::OutputFile::initialize(OutputFile *this,Header *header)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  Format FVar6;
  int iVar7;
  Box2i *pBVar8;
  LineOrder *pLVar9;
  size_t maxScanLineSize;
  LineBuffer *pLVar10;
  Compression *pCVar11;
  Compressor *pCVar12;
  pointer ppLVar13;
  char *pcVar14;
  ulong uVar15;
  Data *pDVar16;
  
  Header::operator=(&this->_data->header,header);
  bVar5 = Header::hasType(&this->_data->header);
  if (bVar5) {
    Header::setType(&this->_data->header,(string *)&Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
  }
  pBVar8 = Header::dataWindow(header);
  pLVar9 = Header::lineOrder(header);
  iVar7 = (pBVar8->min).y;
  iVar1 = (pBVar8->max).y;
  iVar4 = iVar1;
  if (*pLVar9 == INCREASING_Y) {
    iVar4 = iVar7;
  }
  pDVar16 = this->_data;
  pDVar16->currentScanLine = iVar4;
  pDVar16->missingScanLines = (iVar1 - iVar7) + 1;
  pLVar9 = Header::lineOrder(header);
  pDVar16 = this->_data;
  pDVar16->lineOrder = *pLVar9;
  iVar7 = (pBVar8->min).y;
  iVar1 = (pBVar8->max).x;
  iVar4 = (pBVar8->max).y;
  pDVar16->minX = (pBVar8->min).x;
  pDVar16->maxX = iVar1;
  pDVar16->minY = iVar7;
  pDVar16->maxY = iVar4;
  maxScanLineSize = bytesPerLineTable(&pDVar16->header,&pDVar16->bytesPerLine);
  pDVar16 = this->_data;
  ppLVar13 = (pDVar16->lineBuffers).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar16->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppLVar13) {
    uVar15 = 0;
    do {
      pLVar10 = (LineBuffer *)operator_new(0x90);
      pCVar11 = Header::compression(&pDVar16->header);
      pCVar12 = newCompressor(*pCVar11,maxScanLineSize,&this->_data->header);
      *(undefined1 (*) [16])((long)&(pLVar10->buffer)._data + 4) = (undefined1  [16])0x0;
      (pLVar10->buffer)._size = 0;
      (pLVar10->buffer)._data = (char *)0x0;
      pLVar10->compressor = pCVar12;
      pLVar10->partiallyFull = false;
      pLVar10->hasException = false;
      (pLVar10->exception)._M_dataplus._M_p = (pointer)&(pLVar10->exception).field_2;
      (pLVar10->exception)._M_string_length = 0;
      (pLVar10->exception).field_2._M_local_buf[0] = '\0';
      IlmThread_2_5::Semaphore::Semaphore(&pLVar10->_sem,1);
      (this->_data->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15] = pLVar10;
      uVar15 = uVar15 + 1;
      pDVar16 = this->_data;
      ppLVar13 = (pDVar16->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(pDVar16->lineBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar13 >> 3
                             ));
  }
  pLVar10 = *ppLVar13;
  FVar6 = defaultFormat(pLVar10->compressor);
  this->_data->format = FVar6;
  iVar7 = numLinesInBuffer(pLVar10->compressor);
  pDVar16 = this->_data;
  pDVar16->linesInBuffer = iVar7;
  pDVar16->lineBufferSize = maxScanLineSize * (long)iVar7;
  ppLVar13 = (pDVar16->lineBuffers).
             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((pDVar16->lineBuffers).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppLVar13) {
    uVar15 = 0;
    do {
      pLVar10 = ppLVar13[uVar15];
      uVar2 = pDVar16->lineBufferSize;
      pcVar14 = (char *)operator_new__(uVar2);
      pcVar3 = (pLVar10->buffer)._data;
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
        pDVar16 = this->_data;
      }
      (pLVar10->buffer)._size = uVar2;
      (pLVar10->buffer)._data = pcVar14;
      uVar15 = uVar15 + 1;
      ppLVar13 = (pDVar16->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar15 < (ulong)((long)(pDVar16->lineBuffers).
                                    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar13 >> 3
                             ));
    iVar7 = pDVar16->linesInBuffer;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar16->lineOffsets,(long)((((pBVar8->max).y - (pBVar8->min).y) + iVar7) / iVar7));
  pDVar16 = this->_data;
  offsetInLineBufferTable
            (&pDVar16->bytesPerLine,pDVar16->linesInBuffer,&pDVar16->offsetInLineBuffer);
  return;
}

Assistant:

void
OutputFile::initialize (const Header &header)
{
    _data->header = header;

    // "fix" the type if it happens to be set incorrectly
    // (attribute is optional, but ensure it is correct if it exists)
    if(_data->header.hasType())
    {
        _data->header.setType(SCANLINEIMAGE);
    }
    
    const Box2i &dataWindow = header.dataWindow();

    _data->currentScanLine = (header.lineOrder() == INCREASING_Y)?
				 dataWindow.min.y: dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder = header.lineOrder();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    size_t maxBytesPerLine = bytesPerLineTable (_data->header,
						_data->bytesPerLine);

    for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
    {
        _data->lineBuffers[i] =
	    new LineBuffer (newCompressor (_data->header.compression(),
					   maxBytesPerLine,
					   _data->header));
    }

    LineBuffer *lineBuffer = _data->lineBuffers[0];
    _data->format = defaultFormat (lineBuffer->compressor);
    _data->linesInBuffer = numLinesInBuffer (lineBuffer->compressor);
    _data->lineBufferSize = maxBytesPerLine * _data->linesInBuffer;

    for (size_t i = 0; i < _data->lineBuffers.size(); i++)
        _data->lineBuffers[i]->buffer.resizeErase(_data->lineBufferSize);

    int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
			  _data->linesInBuffer) / _data->linesInBuffer;

    _data->lineOffsets.resize (lineOffsetSize);
    
    
    offsetInLineBufferTable (_data->bytesPerLine,
			     _data->linesInBuffer,
			     _data->offsetInLineBuffer);
}